

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

void Cloud_bddPrintCube(CloudManager *dd,CloudNode *bCube)

{
  CloudNode *pCVar1;
  char *__format;
  CloudNode *pCVar2;
  bool bVar3;
  
  if ((*(uint *)(((ulong)bCube & 0xfffffffffffffffe) + 4) & 0xefffffff) == 0xfffffff) {
    __assert_fail("!Cloud_IsConstant(bCube)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x388,"void Cloud_bddPrintCube(CloudManager *, CloudNode *)");
  }
  do {
    pCVar2 = bCube->e;
    if (((ulong)bCube & 1) == 0) {
      pCVar1 = bCube->t;
    }
    else {
      pCVar2 = (CloudNode *)((ulong)pCVar2 ^ 1);
      pCVar1 = (CloudNode *)((ulong)bCube->t ^ 1);
    }
    if (pCVar2 == dd->zero) {
      __format = "[%d]";
      if (pCVar1 == pCVar2) {
        __assert_fail("bCube1 != dd->zero",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                      ,0x3a3,"void Cloud_bddPrintCube(CloudManager *, CloudNode *)");
      }
    }
    else {
      __format = "[%d]\'";
      bVar3 = pCVar1 != dd->zero;
      pCVar1 = pCVar2;
      if (bVar3) {
        __assert_fail("bCube1 == dd->zero",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                      ,0x39d,"void Cloud_bddPrintCube(CloudManager *, CloudNode *)");
      }
    }
    printf(__format,(ulong)bCube->v);
    bCube = pCVar1;
  } while ((*(uint *)(((ulong)pCVar1 & 0xfffffffffffffffe) + 4) & 0xefffffff) != 0xfffffff);
  return;
}

Assistant:

void Cloud_bddPrintCube( CloudManager * dd, CloudNode * bCube )
{
	CloudNode * bCube0, * bCube1;

	assert( !Cloud_IsConstant(bCube) );
	while ( 1 )
	{
		// get the node structure
		if ( Cloud_IsConstant(bCube) )
			break;

		// cofactor the cube
		if ( Cloud_IsComplement(bCube) )
		{
			bCube0 = Cloud_Not( cloudE(bCube) );
			bCube1 = Cloud_Not( cloudT(bCube) );
		}
		else
		{
			bCube0 = cloudE(bCube);
			bCube1 = cloudT(bCube);
		}

		if ( bCube0 != dd->zero )
		{
			assert( bCube1 == dd->zero );
			printf( "[%d]'", cloudV(bCube) );
			bCube = bCube0;
		}
		else
		{
			assert( bCube1 != dd->zero );
			printf( "[%d]", cloudV(bCube) );
			bCube = bCube1;
		}
	}
}